

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O3

void __thiscall VRle::Data::opIntersect(Data *this,View a,View b)

{
  Span *pSVar1;
  Span *pSVar2;
  pointer pSVar3;
  size_t sVar4;
  Span *pSVar5;
  long lVar6;
  Span *pSVar7;
  ulong __n;
  size_t sVar8;
  Result result;
  rle_view local_840;
  rle_view local_830;
  Span local_820 [255];
  
  sVar8 = b._size;
  local_830._data = b._data;
  sVar4 = a._size;
  pSVar7 = a._data;
  pSVar1 = pSVar7 + sVar4;
  pSVar2 = local_830._data + sVar8;
  local_840._data = pSVar7;
  if (sVar4 != 0) {
    lVar6 = sVar4 << 3;
    do {
      if ((local_830._data)->y <= pSVar7->y) {
        local_840._data = pSVar7;
        if (sVar8 != 0) {
          lVar6 = sVar8 << 3;
          pSVar5 = local_830._data;
          goto LAB_00112064;
        }
        break;
      }
      pSVar7 = pSVar7 + 1;
      lVar6 = lVar6 + -8;
      local_840._data = pSVar1;
    } while (lVar6 != 0);
  }
  goto LAB_00112078;
  while( true ) {
    pSVar5 = pSVar5 + 1;
    lVar6 = lVar6 + -8;
    local_830._data = pSVar2;
    if (lVar6 == 0) break;
LAB_00112064:
    local_830._data = pSVar5;
    if (pSVar7->y <= pSVar5->y) break;
  }
LAB_00112078:
  local_840._size = (long)pSVar1 - (long)local_840._data >> 3;
  local_830._size = (long)pSVar2 - (long)local_830._data >> 3;
  lVar6 = 0;
  do {
    *(undefined4 *)((long)&local_820[0].y + lVar6 + 1) = 0;
    *(undefined4 *)((long)&local_820[0].x + lVar6) = 0;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x7f8);
  if (pSVar1 != local_840._data) {
    do {
      sVar4 = _opIntersect(&local_840,&local_830,(Result *)local_820);
      if (sVar4 != 0) {
        pSVar3 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __n = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) + sVar4;
        if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3 >> 3) <
            __n) {
          std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,__n);
        }
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                  (local_820,local_820 + sVar4,
                   (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this
                  );
      }
    } while (local_840._size != 0);
  }
  updateBbox(this);
  return;
}

Assistant:

void VRle::Data::opIntersect(VRle::View a, VRle::View b)
{
    _opIntersectPrepare(a, b);
    Result result;
    while (a.size()) {
        auto count = _opIntersect(a, b, result);
        if (count) copy(result.data(), count, mSpans);
    }

    updateBbox();
}